

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O0

void get_esis_after_loss(int nESIs,uint32_t *ESIs,float loss)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  int j;
  int esi;
  undefined4 local_1c;
  undefined4 local_18;
  
  local_18 = -1;
  for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
    do {
      local_18 = local_18 + 1;
      iVar1 = rand();
    } while ((float)iVar1 / 2.1474836e+09 < in_XMM0_Da);
    *(int *)(in_RSI + (long)local_1c * 4) = local_18;
  }
  return;
}

Assistant:

void get_esis_after_loss(int nESIs, uint32_t* ESIs, float loss)
{
	int esi = -1;
	for (int j = 0; j < nESIs; ++j) {
		do {
			++esi;
		} while (rand() / (RAND_MAX + 1.0) < loss);
		ESIs[j] = esi;
	}
}